

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O3

void calc4::EmitCppCode<__int128>
               (shared_ptr<const_calc4::Operator> *op,CompilationContext *context,ostream *ostream)

{
  _Rb_tree_header *p_Var1;
  OperatorInformation *pOVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Base_ptr *pp_Var4;
  element_type *peVar5;
  long lVar6;
  char cVar7;
  undefined8 this;
  ostream *poVar8;
  _Base_ptr p_Var9;
  ulong uVar10;
  _Rb_tree_node_base *p_Var11;
  long *plVar12;
  int iVar13;
  int iVar14;
  __normal_iterator<calc4::(anonymous_namespace)::OperatorInformation_*,_std::vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>_>
  __i;
  long lVar15;
  OperatorInformation *pOVar16;
  pointer pOVar17;
  _Self __tmp;
  pointer info;
  vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
  infos;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  variableNames;
  bool local_101;
  CompilationContext *local_100;
  OperatorInformation *local_f8;
  OperatorDefinition local_f0;
  _Deque_base<int,_std::allocator<int>_> local_c8;
  vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
  local_78;
  _Base_ptr *local_60;
  _Rb_tree_node_base local_58;
  size_t local_38;
  
  local_100 = context;
  std::__ostream_insert<char,std::char_traits<char>>(ostream,"#include <cstdint>",0x12);
  cVar7 = (char)ostream;
  std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(ostream,"#include <iostream>",0x13);
  std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(ostream,"#include <unordered_map>",0x18);
  std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(ostream,"std::unordered_map<",0x13);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(ostream,"__int128_t",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,"__int128_t",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"> ",2);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Memory",6);
  local_f0.name._M_dataplus._M_p._0_1_ = 0x3b;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_f0,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(ostream,"int ",4);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(ostream,"GetChar",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"()",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(ostream,"{",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(ostream,"    ",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return std::cin.get();",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(ostream,"}",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(ostream,"void ",5);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(ostream,"Print",5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(",1);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,"__int128_t",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," value)",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  local_f0.name._M_dataplus._M_p._0_1_ = 0x7b;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(ostream,(char *)&local_f0,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(ostream,"    ",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"std::cout << static_cast<char>(value);",0x26);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  local_f0.name._M_dataplus._M_p._0_1_ = 0x7d;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(ostream,(char *)&local_f0,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  local_78.
  super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
  ._M_impl.super__Vector_impl_data._M_start = (OperatorInformation *)0x0;
  local_78.
  super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
  ._M_impl.super__Vector_impl_data._M_finish = (OperatorInformation *)0x0;
  local_78.
  super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pp_Var4 = &local_58._M_parent;
  local_58._M_parent._0_5_ = 0x5f6e69616d;
  local_58._M_parent._5_3_ = 0x65706f;
  local_58._M_left._0_5_ = 0x726f746172;
  local_58._M_color = 0xd;
  local_58._4_4_ = 0;
  local_58._M_left._5_1_ = 0;
  paVar3 = &local_f0.name.field_2;
  local_f0.name._M_dataplus._M_p = (pointer)paVar3;
  local_60 = pp_Var4;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f0,pp_Var4);
  local_f0._32_8_ = (ulong)(uint)local_f0._36_4_ << 0x20;
  local_101 = true;
  std::
  vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>
  ::emplace_back<calc4::OperatorDefinition,std::shared_ptr<calc4::Operator_const>const&,bool>
            ((vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>
              *)&local_78,&local_f0,op,&local_101);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.name._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0.name._M_dataplus._M_p,
                    (ulong)(local_f0.name.field_2._M_allocated_capacity + 1));
  }
  if (local_60 != pp_Var4) {
    operator_delete(local_60,CONCAT35(local_58._M_parent._5_3_,local_58._M_parent._0_5_) + 1);
  }
  p_Var9 = (local_100->userDefinedOperators)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(local_100->userDefinedOperators)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var1) {
    do {
      local_f0.name._M_dataplus._M_p = local_f0.name._M_dataplus._M_p & 0xffffffffffffff00;
      std::
      vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>
      ::
      emplace_back<calc4::OperatorDefinition_const&,std::shared_ptr<calc4::Operator_const>const&,bool>
                ((vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>
                  *)&local_78,(OperatorDefinition *)(p_Var9 + 2),
                 (shared_ptr<const_calc4::Operator> *)&p_Var9[3]._M_parent,(bool *)&local_f0);
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var1);
  }
  pOVar17 = local_78.
            super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  info = local_78.
         super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pOVar2 = local_78.
           super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
           ._M_impl.super__Vector_impl_data._M_start + 1;
  if (pOVar2 != local_78.
                super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    lVar15 = (long)local_78.
                   super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2;
    uVar10 = lVar15 >> 6;
    lVar6 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<calc4::(anonymous_namespace)::OperatorInformation*,std::vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<calc4::EmitCppCode<__int128>(std::shared_ptr<calc4::Operator_const>const&,calc4::CompilationContext_const&,std::ostream&)::_lambda(auto:1&,auto:2&)_1_>>
              (pOVar2,local_78.
                      super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
                      ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar15 < 0x401) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<calc4::(anonymous_namespace)::OperatorInformation*,std::vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>>,__gnu_cxx::__ops::_Iter_comp_iter<calc4::EmitCppCode<__int128>(std::shared_ptr<calc4::Operator_const>const&,calc4::CompilationContext_const&,std::ostream&)::_lambda(auto:1&,auto:2&)_1_>>
                (pOVar2,pOVar17);
    }
    else {
      pOVar16 = info + 0x11;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<calc4::(anonymous_namespace)::OperatorInformation*,std::vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>>,__gnu_cxx::__ops::_Iter_comp_iter<calc4::EmitCppCode<__int128>(std::shared_ptr<calc4::Operator_const>const&,calc4::CompilationContext_const&,std::ostream&)::_lambda(auto:1&,auto:2&)_1_>>
                (pOVar2,pOVar16);
      for (; pOVar16 != pOVar17; pOVar16 = pOVar16 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<calc4::(anonymous_namespace)::OperatorInformation*,std::vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>>,__gnu_cxx::__ops::_Val_comp_iter<calc4::EmitCppCode<__int128>(std::shared_ptr<calc4::Operator_const>const&,calc4::CompilationContext_const&,std::ostream&)::_lambda(auto:1&,auto:2&)_1_>>
                  (pOVar16);
      }
    }
  }
  local_f8 = pOVar17;
  if (info != pOVar17) {
    pOVar17 = info;
    do {
      anon_unknown_0::EmitDeclaration<__int128>(pOVar17,ostream);
      local_f0.name._M_dataplus._M_p._0_1_ = 0x3b;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(ostream,(char *)&local_f0,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      pOVar17 = pOVar17 + 1;
    } while (pOVar17 != local_f8);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  anon_unknown_0::GatherVariableNames
            ((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)&local_60,op,local_100);
  if (local_38 != 0) {
    for (p_Var11 = (_Rb_tree_node_base *)
                   CONCAT26(local_58._M_left._6_2_,
                            CONCAT15(local_58._M_left._5_1_,local_58._M_left._0_5_));
        p_Var11 != &local_58; p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(ostream,"__int128_t",10);
      local_f0.name._M_dataplus._M_p._0_1_ = 0x20;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_f0,1);
      lVar6 = *(long *)(p_Var11 + 1);
      p_Var9 = p_Var11[1]._M_parent;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"user_defined_var_",0x11);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)p_Var9,lVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," = 0;",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar7);
    std::ostream::put(cVar7);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>(ostream,"int main()",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  local_f0.name._M_dataplus._M_p._0_1_ = 0x7b;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(ostream,(char *)&local_f0,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(ostream,"    ",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"std::cout << ",0xd);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,"main_operator",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"() << std::endl;",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  local_f0.name._M_dataplus._M_p._0_1_ = 0x7d;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(ostream,(char *)&local_f0,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  plVar12 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
  std::ostream::put((char)plVar12);
  std::ostream::flush();
  if (info != local_f8) {
    do {
      if (info->isMain == false) {
        std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar7);
        std::ostream::put(cVar7);
        std::ostream::flush();
      }
      anon_unknown_0::EmitDeclaration<__int128>(info,ostream);
      std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
      local_f0.name._M_dataplus._M_p._0_1_ = 0x7b;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(ostream,(char *)&local_f0,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(ostream,"Entry",5);
      local_f0.name._M_dataplus._M_p._0_1_ = 0x3a;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_f0,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      local_f0.name._M_dataplus._M_p = (pointer)&PTR_Visit_0014ac08;
      local_f0.name.field_2._M_allocated_capacity = (size_type)local_100;
      local_f0._32_8_ = -0xffffffff;
      local_c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      local_c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_c8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_c8._M_impl.super__Deque_impl_data._M_map_size = 0;
      local_f0.name._M_string_length = (size_type)info;
      local_f0.name.field_2._8_8_ = ostream;
      std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_c8,0);
      peVar5 = (info->op).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (**peVar5->_vptr_Operator)(peVar5,&local_f0);
      if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        iVar14 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x7f];
        operator_delete(local_c8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
        local_c8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_c8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x80;
        local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x7f;
        local_c8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_c8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        iVar14 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1];
        local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      if (-1 < iVar14) {
        if (0 < local_f0.numOperands) {
          iVar13 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_f0.name.field_2._8_8_,"    ",4);
            iVar13 = iVar13 + 1;
          } while (iVar13 < local_f0.numOperands);
        }
        this = local_f0.name.field_2._8_8_;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_f0.name.field_2._8_8_,"return ",7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"var_",4);
        poVar8 = (ostream *)std::ostream::operator<<((void *)this,iVar14);
        local_101 = true;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_101,1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      local_101 = true;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(ostream,&local_101,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      local_f0.name._M_dataplus._M_p = (pointer)&PTR_Visit_0014ac08;
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_c8);
      info = info + 1;
    } while (info != local_f8);
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)&local_60);
  std::
  vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
  ::~vector(&local_78);
  return;
}

Assistant:

void EmitCppCode(const std::shared_ptr<const Operator>& op, const CompilationContext& context,
                 std::ostream& ostream)
{
    /* Emit header */
    ostream << "#include <cstdint>" << std::endl;

#ifdef ENABLE_GMP
    if constexpr (std::is_same_v<TNumber, mpz_class>)
    {
        ostream << "#include <gmpxx.h>" << std::endl;
    }
#endif // ENABLE_GMP

    ostream << "#include <iostream>" << std::endl;
    ostream << "#include <unordered_map>" << std::endl;
    ostream << std::endl;
    ostream << "std::unordered_map<" << TypeName<TNumber>() << ", " << TypeName<TNumber>() << "> "
            << MemoryFieldName() << ';' << std::endl;
    ostream << std::endl;
    ostream << "int " << GetCharFunctionName() << "()" << std::endl;
    ostream << "{" << std::endl;
    ostream << IndentText << "return std::cin.get();" << std::endl;
    ostream << "}" << std::endl;
    ostream << std::endl;
    ostream << "void " << PrintFunctionName() << "(" << TypeName<TNumber>() << " value)"
            << std::endl;
    ostream << '{' << std::endl;
    ostream << IndentText << "std::cout << static_cast<char>(value);" << std::endl;
    ostream << '}' << std::endl;
    ostream << std::endl;

    /* Gather information of operators and sort */
    std::vector<OperatorInformation> infos;
    infos.emplace_back(OperatorDefinition(std::string(MainOperatorName), 0), op, true);

    for (auto it = context.UserDefinedOperatorBegin(); it != context.UserDefinedOperatorEnd(); it++)
    {
        infos.emplace_back(it->second.GetDefinition(), it->second.GetOperator(), false);
    }

    std::sort(infos.begin() + 1, infos.end(), [](auto& left, auto& right) {
        return left.definition.GetName() < right.definition.GetName();
    });

    /* Emit forward declarations */
    for (auto& info : infos)
    {
        EmitDeclaration<TNumber>(info, ostream);
        ostream << ';' << std::endl;
    }

    ostream << std::endl;

    /* Gather variable names */
    std::set<std::string_view> variableNames = GatherVariableNames(op, context);

    /* Emit variable definitions */
    if (!variableNames.empty())
    {
        for (auto& variableName : variableNames)
        {
            ostream << TypeName<TNumber>() << ' ' << UserDefinedVariableName(variableName)
                    << " = 0;" << std::endl;
        }

        ostream << std::endl;
    }

    /* Emit main */
    ostream << "int main()" << std::endl;
    ostream << '{' << std::endl;
    ostream << IndentText << "std::cout << " << MainOperatorName << "() << std::endl;" << std::endl;
    ostream << '}' << std::endl << std::endl;

    /* Emit definitions */
    for (auto& info : infos)
    {
        if (!info.isMain)
        {
            ostream << std::endl;
        }

        EmitOperator<TNumber>(info, context, ostream);
    }
}